

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbrp_setup_heuristic(stbrp_context *context,int heuristic)

{
  int heuristic_local;
  stbrp_context *context_local;
  
  if (context->init_mode == 1) {
    context->heuristic = heuristic;
  }
  return;
}

Assistant:

STBRP_DEF void stbrp_setup_heuristic(stbrp_context *context, int heuristic)
{
switch (context->init_mode) {
case STBRP__INIT_skyline:
STBRP_ASSERT(heuristic == STBRP_HEURISTIC_Skyline_BL_sortHeight || heuristic == STBRP_HEURISTIC_Skyline_BF_sortHeight);
context->heuristic = heuristic;
break;
default:
STBRP_ASSERT(0);
}
}